

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  byte *pbVar4;
  size_t local_38;
  size_t len;
  
  iVar3 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (iVar3 == 0) {
    pbVar4 = *p;
    if (pbVar4 + local_38 == end) {
      while (pbVar4 < end) {
        *p = pbVar4 + 1;
        bVar1 = *pbVar4;
        if ((bVar1 & tag_must_mask) != tag_must_val) {
          return -0x62;
        }
        iVar3 = mbedtls_asn1_get_len(p,end,&local_38);
        sVar2 = local_38;
        if (iVar3 != 0) {
          return iVar3;
        }
        if (((cb != (_func_int_void_ptr_int_uchar_ptr_size_t *)0x0) &&
            ((bVar1 & tag_may_mask) == tag_may_val)) &&
           (iVar3 = (*cb)(ctx,(int)bVar1,*p,local_38), iVar3 != 0)) {
          return iVar3;
        }
        pbVar4 = *p + sVar2;
        *p = pbVar4;
      }
      iVar3 = 0;
    }
    else {
      iVar3 = -0x66;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)(void *ctx, int tag,
              unsigned char *start, size_t len),
    void *ctx)
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (*p + len != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    while (*p < end) {
        unsigned char const tag = *(*p)++;

        if ((tag & tag_must_mask) != tag_must_val) {
            return MBEDTLS_ERR_ASN1_UNEXPECTED_TAG;
        }

        if ((ret = mbedtls_asn1_get_len(p, end, &len)) != 0) {
            return ret;
        }

        if ((tag & tag_may_mask) == tag_may_val) {
            if (cb != NULL) {
                ret = cb(ctx, tag, *p, len);
                if (ret != 0) {
                    return ret;
                }
            }
        }

        *p += len;
    }

    return 0;
}